

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatTransientSingleSpace.h
# Opt level: O3

void __thiscall
TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>>::ContributeBCInterface
          (TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>> *this)

{
  TPZFMatrix<double> *in_RCX;
  TPZMaterialDataT<double> *in_RDX;
  TPZMaterialDataT<double> *in_RSI;
  TPZFMatrix<double> *in_R8;
  TPZBndCondT<double> *in_R9;
  REAL in_XMM0_Qa;
  
  TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>_>::ContributeBCInterface
            ((TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>_> *)(this + -0x48),in_RSI,
             in_RDX,in_XMM0_Qa,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

void TPZMatTransientSingleSpace< TBASEMAT >::ContributeBCInterface(
    const TPZMaterialDataT<STATE> &data,
    const TPZMaterialDataT<STATE> &dataleft,
    REAL weight, 
    TPZFMatrix<STATE> &ek,
    TPZFMatrix<STATE> &ef,
    TPZBndCondT<STATE> &bc)
{
	// Mostly for implicit
	if (this->fStep == ECurrent){
		TBASEMAT::ContributeBCInterface(data,dataleft, weight,ek, ef, bc);
		return;
	}
	
	if (this->fStep == ELast){
		return;
	}
	
	
	// Mostly for explicit
	if (this->fStep == EMassMatrix){
		return;
	}
	if (this->fStep == EFluxOnly){ //Calculates ef = F-ku
		TBASEMAT::ContributeBCInterface(data, dataleft, weight,  ek, ef, bc);
		return;
	}
	
	
	PZError << "ERROR! " << __PRETTY_FUNCTION__ << " at LINE " << __LINE__ << std::endl;
	
}